

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall
ProtoStoreInternal::restoreXml(ProtoStoreInternal *this,Element *el,ProtoModel *model)

{
  pointer *ppbVar1;
  Element *this_00;
  TypeFactory *this_01;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int4 iVar5;
  string *psVar6;
  LowlevelError *this_02;
  Architecture *manage;
  List *this_03;
  undefined4 extraout_var;
  reference pvVar7;
  reference ppEVar8;
  Datatype *pDVar9;
  ulong uVar10;
  size_type sVar11;
  pointer ppDVar12;
  undefined4 extraout_var_01;
  reference pvVar13;
  undefined4 extraout_var_02;
  reference rVar14;
  reference local_2a0;
  reference local_290;
  reference local_280;
  allocator local_269;
  string local_268 [32];
  uint local_248;
  uint local_244;
  uint4 i_2;
  uint4 j;
  _Bit_type local_238;
  reference local_230;
  int local_21c;
  undefined1 local_218 [4];
  int4 i_1;
  vector<Datatype_*,_std::allocator<Datatype_*>_> typelist;
  ProtoParameter *curparam;
  Element **local_1e8;
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_1e0
  ;
  const_iterator subiter;
  List *sublist;
  ParameterPieces *curparam_1;
  uintb uStack_1c0;
  Datatype *local_1b8;
  undefined8 uStack_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  string *attr;
  uint local_190;
  int4 i;
  uint4 flags;
  bool namelock;
  bool typelock;
  string name;
  Element *subel;
  Element **local_158;
  Address local_150;
  allocator local_139;
  string local_138 [32];
  ParameterPieces local_118;
  byte local_f1;
  undefined1 local_f0 [7];
  bool addressesdetermined;
  vector<bool,_std::allocator<bool>_> namelocklist;
  vector<bool,_std::allocator<bool>_> typelocklist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namelist;
  vector<ParameterPieces,_std::allocator<ParameterPieces>_> pieces;
  const_iterator iter;
  List *list;
  Architecture *glb;
  allocator local_41;
  string local_40 [32];
  ProtoModel *local_20;
  ProtoModel *model_local;
  Element *el_local;
  ProtoStoreInternal *this_local;
  undefined4 extraout_var_00;
  
  local_20 = model;
  model_local = (ProtoModel *)el;
  el_local = (Element *)this;
  psVar6 = Element::getName_abi_cxx11_(el);
  bVar2 = std::operator!=(psVar6,"internallist");
  if (bVar2) {
    this_02 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"Mismatched ProtoStore tag: ProtoStoreInternal did not get <internallist>",
               &local_41);
    LowlevelError::LowlevelError(this_02,(string *)local_40);
    __cxa_throw(this_02,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  manage = ProtoModel::getArch(local_20);
  this_03 = Element::getChildren((Element *)model_local);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  __normal_iterator((__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                     *)&pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::vector
            ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
             &namelist.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&typelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_f0);
  local_f1 = 1;
  local_118.type = (Datatype *)0x0;
  local_118.flags = 0;
  local_118._28_4_ = 0;
  local_118.addr.base = (AddrSpace *)0x0;
  local_118.addr.offset = 0;
  ParameterPieces::ParameterPieces(&local_118);
  std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::push_back
            ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
             &namelist.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"ret",&local_139);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&typelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,(value_type *)local_138);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  iVar3 = (*this->outparam->_vptr_ProtoParameter[6])();
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)
             &namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,(bool)((byte)iVar3 & 1));
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)local_f0,false);
  iVar3 = (*this->outparam->_vptr_ProtoParameter[3])();
  ppbVar1 = &namelist.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar7 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                     ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)ppbVar1);
  pvVar7->type = (Datatype *)CONCAT44(extraout_var,iVar3);
  pvVar7 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                     ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)ppbVar1);
  pvVar7->flags = 0;
  uVar4 = (*this->outparam->_vptr_ProtoParameter[9])();
  if ((uVar4 & 1) != 0) {
    pvVar7 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                       ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                        &namelist.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar7->flags = pvVar7->flags | 0x10000000;
  }
  (*this->outparam->_vptr_ProtoParameter[4])(&local_150);
  bVar2 = Address::isInvalid(&local_150);
  if (bVar2) {
    local_f1 = 0;
  }
  local_158 = (Element **)std::vector<Element_*,_std::allocator<Element_*>_>::begin(this_03);
  pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_158;
  while( true ) {
    subel = (Element *)std::vector<Element_*,_std::allocator<Element_*>_>::end(this_03);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                        *)&pieces.
                           super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                        *)&subel);
    if (!bVar2) break;
    ppEVar8 = __gnu_cxx::
              __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
              ::operator*((__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                           *)&pieces.
                              super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = *ppEVar8;
    std::__cxx11::string::string((string *)&flags);
    i._3_1_ = 0;
    i._2_1_ = 0;
    local_190 = 0;
    for (attr._4_4_ = 0; iVar3 = attr._4_4_, iVar5 = Element::getNumAttributes(this_00),
        iVar3 < iVar5; attr._4_4_ = attr._4_4_ + 1) {
      local_1a0 = Element::getAttributeName_abi_cxx11_(this_00,attr._4_4_);
      bVar2 = std::operator==(local_1a0,"name");
      if (bVar2) {
        psVar6 = Element::getAttributeValue_abi_cxx11_(this_00,attr._4_4_);
        std::__cxx11::string::operator=((string *)&flags,(string *)psVar6);
      }
      else {
        bVar2 = std::operator==(local_1a0,"typelock");
        if (bVar2) {
          psVar6 = Element::getAttributeValue_abi_cxx11_(this_00,attr._4_4_);
          i._3_1_ = xml_readbool(psVar6);
        }
        else {
          bVar2 = std::operator==(local_1a0,"namelock");
          if (bVar2) {
            psVar6 = Element::getAttributeValue_abi_cxx11_(this_00,attr._4_4_);
            i._2_1_ = xml_readbool(psVar6);
          }
          else {
            bVar2 = std::operator==(local_1a0,"indirectstorage");
            if (bVar2) {
              psVar6 = Element::getAttributeValue_abi_cxx11_(this_00,attr._4_4_);
              bVar2 = xml_readbool(psVar6);
              if (bVar2) {
                local_190 = local_190 | 0x10000000;
              }
            }
            else {
              bVar2 = std::operator==(local_1a0,"hiddenretparm");
              if (bVar2) {
                psVar6 = Element::getAttributeValue_abi_cxx11_(this_00,attr._4_4_);
                bVar2 = xml_readbool(psVar6);
                if (bVar2) {
                  local_190 = local_190 | 0x20000000;
                }
              }
            }
          }
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&typelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,(value_type *)&flags);
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)
               &namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,(bool)(i._3_1_ & 1));
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)local_f0,(bool)(i._2_1_ & 1));
    local_1b8 = (Datatype *)0x0;
    uStack_1b0._0_4_ = 0;
    uStack_1b0._4_4_ = 0;
    curparam_1 = (ParameterPieces *)0x0;
    uStack_1c0 = 0;
    ParameterPieces::ParameterPieces((ParameterPieces *)&curparam_1);
    std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::push_back
              ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
               &namelist.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&curparam_1);
    pvVar7 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                       ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                        &namelist.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    subiter._M_current = (Element **)Element::getChildren(this_00);
    __gnu_cxx::
    __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    __normal_iterator(&local_1e0);
    local_1e8 = (Element **)
                std::vector<Element_*,_std::allocator<Element_*>_>::begin(subiter._M_current);
    local_1e0._M_current = local_1e8;
    ppEVar8 = __gnu_cxx::
              __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
              ::operator*(&local_1e0);
    Address::restoreXml((Address *)&curparam,*ppEVar8,&manage->super_AddrSpaceManager);
    Address::operator=(&pvVar7->addr,(Address *)&curparam);
    __gnu_cxx::
    __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator++(&local_1e0);
    this_01 = manage->types;
    ppEVar8 = __gnu_cxx::
              __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
              ::operator*(&local_1e0);
    pDVar9 = TypeFactory::restoreXmlType(this_01,*ppEVar8);
    pvVar7->type = pDVar9;
    pvVar7->flags = local_190;
    bVar2 = Address::isInvalid(&pvVar7->addr);
    if (bVar2) {
      local_f1 = 0;
    }
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)
               &namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,(bool)(i._3_1_ & 1));
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)local_f0,(bool)(i._2_1_ & 1));
    std::__cxx11::string::~string((string *)&flags);
    __gnu_cxx::
    __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator++((__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                *)&pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if ((local_f1 & 1) == 0) {
    std::vector<Datatype_*,_std::allocator<Datatype_*>_>::vector
              ((vector<Datatype_*,_std::allocator<Datatype_*>_> *)local_218);
    for (local_21c = 0; uVar10 = (ulong)local_21c,
        sVar11 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::size
                           ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                            &namelist.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar10 < sVar11;
        local_21c = local_21c + 1) {
      pvVar7 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::operator[]
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          &namelist.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_21c);
      std::vector<Datatype_*,_std::allocator<Datatype_*>_>::push_back
                ((vector<Datatype_*,_std::allocator<Datatype_*>_> *)local_218,&pvVar7->type);
    }
    ppbVar1 = &namelist.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::clear
              ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)ppbVar1);
    ProtoModel::assignParameterStorage
              (local_20,(vector<Datatype_*,_std::allocator<Datatype_*>_> *)local_218,
               (vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)ppbVar1,true);
    pvVar7 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::operator[]
                       ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                        &namelist.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    bVar2 = Address::isInvalid(&pvVar7->addr);
    if (bVar2) {
      local_230 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)
                             &namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage,0);
      std::_Bit_reference::operator=(&local_230,false);
    }
    pvVar7 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::operator[]
                       ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                        &namelist.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    iVar3 = (*(this->super_ProtoStore)._vptr_ProtoStore[7])(this,pvVar7);
    ppDVar12 = (pointer)CONCAT44(extraout_var_00,iVar3);
    typelist.super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppDVar12;
    _i_2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)
                      &namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,0);
    bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&i_2);
    (**(code **)&(*ppDVar12)[1].field_0x20)(ppDVar12,bVar2);
    std::vector<Datatype_*,_std::allocator<Datatype_*>_>::~vector
              ((vector<Datatype_*,_std::allocator<Datatype_*>_> *)local_218);
  }
  local_244 = 1;
  local_248 = 1;
  while( true ) {
    uVar10 = (ulong)local_248;
    sVar11 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::size
                       ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                        &namelist.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar11 <= uVar10) break;
    pvVar7 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::operator[]
                       ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                        &namelist.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_248);
    if ((pvVar7->flags & 0x20000000) == 0) {
      uVar4 = local_248 - 1;
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&typelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage,(ulong)local_244);
      pvVar7 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::operator[]
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          &namelist.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_248);
      iVar3 = (*(this->super_ProtoStore)._vptr_ProtoStore[2])(this,(ulong)uVar4,pvVar13,pvVar7);
      ppDVar12 = (pointer)CONCAT44(extraout_var_02,iVar3);
      typelist.super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppDVar12;
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          &namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage,(ulong)local_244);
      local_290 = rVar14;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_290);
      (**(code **)&(*ppDVar12)[1].field_0x20)(ppDVar12,bVar2);
      ppDVar12 = typelist.super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_f0,(ulong)local_244);
      local_2a0 = rVar14;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_2a0);
      (**(code **)&(*ppDVar12)[1].field_0x28)(ppDVar12,bVar2);
      local_244 = local_244 + 1;
    }
    else {
      uVar4 = local_248 - 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,"rethidden",&local_269);
      pvVar7 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::operator[]
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          &namelist.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_248);
      iVar3 = (*(this->super_ProtoStore)._vptr_ProtoStore[2])(this,(ulong)uVar4,local_268,pvVar7);
      typelist.super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_01,iVar3);
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      ppDVar12 = typelist.super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          &namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage,0);
      local_280 = rVar14;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_280);
      (**(code **)&(*ppDVar12)[1].field_0x20)(ppDVar12,bVar2);
    }
    local_248 = local_248 + 1;
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_f0)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)
             &namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&typelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
  std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::~vector
            ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
             &namelist.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ProtoStoreInternal::restoreXml(const Element *el,ProtoModel *model)

{
  if (el->getName() != "internallist")
    throw LowlevelError("Mismatched ProtoStore tag: ProtoStoreInternal did not get <internallist>");
  Architecture *glb = model->getArch();
  const List &list(el->getChildren());
  List::const_iterator iter;
  vector<ParameterPieces> pieces;
  vector<string> namelist;
  vector<bool> typelocklist;
  vector<bool> namelocklist;
  bool addressesdetermined = true;

  pieces.push_back( ParameterPieces() ); // Push on placeholder for output pieces
  namelist.push_back("ret");
  typelocklist.push_back(outparam->isTypeLocked());
  namelocklist.push_back(false);
  pieces.back().type = outparam->getType();
  pieces.back().flags = 0;
  if (outparam->isIndirectStorage())
    pieces.back().flags |= Varnode::indirectstorage;
  if (outparam->getAddress().isInvalid())
    addressesdetermined = false;

  for(iter=list.begin();iter!=list.end();++iter) { // This is only the input params
    const Element *subel = *iter;
    string name;
    bool typelock = false;
    bool namelock = false;
    uint4 flags = 0;
    for(int4 i=0;i<subel->getNumAttributes();++i) {
      const string &attr( subel->getAttributeName(i) );
      if (attr == "name")
	name = subel->getAttributeValue(i);
      else if (attr == "typelock")
	typelock = xml_readbool(subel->getAttributeValue(i));
      else if (attr == "namelock")
	namelock = xml_readbool(subel->getAttributeValue(i));
      else if (attr == "indirectstorage") {
	if (xml_readbool(subel->getAttributeValue(i)))
	  flags |= Varnode::indirectstorage;
      }
      else if (attr == "hiddenretparm") {
	if (xml_readbool(subel->getAttributeValue(i)))
	  flags |= Varnode::hiddenretparm;
      }
    }
    namelist.push_back(name);
    typelocklist.push_back(typelock);
    namelocklist.push_back(namelock);
    pieces.push_back(ParameterPieces());
    ParameterPieces &curparam( pieces.back() );
    const List &sublist(subel->getChildren());
    List::const_iterator subiter;
    subiter = sublist.begin();
    curparam.addr = Address::restoreXml(*subiter,glb);
    ++subiter;
    curparam.type = glb->types->restoreXmlType(*subiter);
    curparam.flags = flags;
    if (curparam.addr.isInvalid())
      addressesdetermined = false;
    typelocklist.push_back(typelock);
    namelocklist.push_back(namelock);
  }
  ProtoParameter *curparam;
  if (!addressesdetermined) {
    // If addresses for parameters are not provided, use
    // the model to derive them from type info
    vector<Datatype *> typelist;
    for(int4 i=0;i<pieces.size();++i) // Save off the restored types
      typelist.push_back( pieces[i].type );
    pieces.clear();		// throw out any other piece information
    model->assignParameterStorage(typelist,pieces,true);
    if (pieces[0].addr.isInvalid()) {	// If could not get valid storage for output
      typelocklist[0] = false;		// Treat as unlocked void
    }
    curparam = setOutput(pieces[0]);
    curparam->setTypeLock(typelocklist[0]);
  }
  uint4 j=1;
  for(uint4 i=1;i<pieces.size();++i) {
    if ((pieces[i].flags&Varnode::hiddenretparm)!=0) {
       curparam = setInput(i-1,"rethidden",pieces[i]);
       curparam->setTypeLock(typelocklist[0]);   // Has output's typelock
       continue;    // increment i but not j
    }
    curparam = setInput(i-1,namelist[j],pieces[i]);
    curparam->setTypeLock(typelocklist[j]);
    curparam->setNameLock(namelocklist[j]);
    j = j + 1;
  }
}